

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O0

QIcon QGenericUnixTheme::xdgFileIcon(QFileInfo *fileInfo)

{
  bool bVar1;
  ulong uVar2;
  undefined8 in_RSI;
  QIconPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *genericIconName;
  QString *iconName;
  QIcon *icon;
  QMimeType mimeType;
  QMimeDatabase mimeDatabase;
  QIconPrivate *this;
  QString *in_stack_ffffffffffffffb8;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QMimeDatabase::QMimeDatabase((QMimeDatabase *)&local_10);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::mimeTypeForFile(&local_18,&local_10,in_RSI,0);
  uVar2 = QMimeType::isValid();
  if ((uVar2 & 1) == 0) {
    QIcon::QIcon((QIcon *)in_RDI);
    goto LAB_00ae516e;
  }
  QMimeType::iconName();
  bVar1 = QString::isEmpty((QString *)0xae50a0);
  if (bVar1) {
LAB_00ae5101:
    QMimeType::genericIconName();
    bVar1 = QString::isEmpty((QString *)0xae5133);
    if (bVar1) {
      QIcon::QIcon((QIcon *)in_RDI);
    }
    else {
      QIcon::fromTheme(in_stack_ffffffffffffffb8);
    }
    QString::~QString((QString *)0xae5164);
  }
  else {
    in_RDI->engine = (QIconEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QIcon::fromTheme(in_stack_ffffffffffffffb8);
    bVar1 = QIcon::isNull((QIcon *)this);
    if (bVar1) {
      QIcon::~QIcon((QIcon *)this);
      goto LAB_00ae5101;
    }
  }
  QString::~QString((QString *)0xae516e);
LAB_00ae516e:
  QMimeType::~QMimeType((QMimeType *)&local_18);
  QMimeDatabase::~QMimeDatabase((QMimeDatabase *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QIcon)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QGenericUnixTheme::xdgFileIcon(const QFileInfo &fileInfo)
{
    QMimeDatabase mimeDatabase;
    QMimeType mimeType = mimeDatabase.mimeTypeForFile(fileInfo);
    if (!mimeType.isValid())
        return QIcon();
    const QString &iconName = mimeType.iconName();
    if (!iconName.isEmpty()) {
        QIcon icon = QIcon::fromTheme(iconName);
        if (!icon.isNull())
            return icon;
    }
    const QString &genericIconName = mimeType.genericIconName();
    return genericIconName.isEmpty() ? QIcon() : QIcon::fromTheme(genericIconName);
}